

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>::dispose
          (ArrayBuilder<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> *this)

{
  Array<capnp::Orphan<capnp::compiler::Token>_> *firstElement;
  RemoveConst<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> *pRVar1;
  Array<capnp::Orphan<capnp::compiler::Token>_> *pAVar2;
  Array<capnp::Orphan<capnp::compiler::Token>_> *endCopy;
  Array<capnp::Orphan<capnp::compiler::Token>_> *posCopy;
  Array<capnp::Orphan<capnp::compiler::Token>_> *ptrCopy;
  ArrayBuilder<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> *this_local;
  
  firstElement = this->ptr;
  pRVar1 = this->pos;
  pAVar2 = this->endPtr;
  if (firstElement != (Array<capnp::Orphan<capnp::compiler::Token>_> *)0x0) {
    this->ptr = (Array<capnp::Orphan<capnp::compiler::Token>_> *)0x0;
    this->pos = (RemoveConst<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> *)0x0;
    this->endPtr = (Array<capnp::Orphan<capnp::compiler::Token>_> *)0x0;
    ArrayDisposer::dispose<kj::Array<capnp::Orphan<capnp::compiler::Token>>>
              (this->disposer,firstElement,((long)pRVar1 - (long)firstElement) / 0x18,
               ((long)pAVar2 - (long)firstElement) / 0x18);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }